

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientSession.cpp
# Opt level: O1

void __thiscall ki::protocol::net::ClientSession::send_keep_alive(ClientSession *this)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined8 uVar3;
  ClientKeepAlive keep_alive;
  ClientKeepAlive local_20;
  
  if ((&this->field_0x38)[(long)this->_vptr_ClientSession[-3]] == '\0') {
    (&this->field_0x38)[(long)this->_vptr_ClientSession[-3]] = 1;
    lVar2 = std::chrono::_V2::steady_clock::now();
    lVar2 = lVar2 - *(long *)(&this->field_0x20 + (long)this->_vptr_ClientSession[-3]);
    auVar1 = SEXT816(lVar2 % 60000000000) * SEXT816(0x431bde82d7b634db);
    control::ClientKeepAlive::ClientKeepAlive
              (&local_20,*(uint16_t *)(&this->field_0x8 + (long)this->_vptr_ClientSession[-3]),
               (short)(auVar1._8_8_ >> 0x12) - (auVar1._14_2_ >> 0xf),
               (uint16_t)(lVar2 / 60000000000));
    Session::send_packet
              ((Session *)((long)&this->_vptr_ClientSession + (long)this->_vptr_ClientSession[-3]),
               true,'\x03',&local_20.super_Serializable);
    uVar3 = std::chrono::_V2::steady_clock::now();
    *(undefined8 *)(&this->field_0x30 + (long)this->_vptr_ClientSession[-3]) = uVar3;
  }
  return;
}

Assistant:

void ClientSession::send_keep_alive()
	{
		// Don't send a keep alive if we're waiting for a response
		if (m_waiting_for_keep_alive_response)
			return;
		m_waiting_for_keep_alive_response = true;

		// Work out how many minutes have been since the establish time, and
		// how many milliseconds we are in to the current minute.
		const auto time_since_establish = std::chrono::steady_clock::now() - m_establish_time;
		const auto minutes = std::chrono::duration_cast<std::chrono::minutes>(time_since_establish);
		const auto milliseconds = std::chrono::duration_cast<std::chrono::milliseconds>(
			time_since_establish - minutes
		).count();

		// Send a KEEP_ALIVE packet
		control::ClientKeepAlive keep_alive(m_id, milliseconds, minutes.count());
		send_packet(true, (uint8_t)control::Opcode::KEEP_ALIVE, keep_alive);
		m_last_sent_heartbeat_time = std::chrono::steady_clock::now();
	}